

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  char **strings;
  char *filepath;
  char *__filename;
  int iVar1;
  int iVar2;
  SolveStatus SVar3;
  cJSON_bool cVar4;
  cJSON_bool cVar5;
  cJSON_bool cVar6;
  cJSON_bool cVar7;
  cJSON_bool cVar8;
  cJSON_bool cVar9;
  cJSON_bool cVar10;
  cJSON_bool cVar11;
  cJSON_bool cVar12;
  cJSON_bool cVar13;
  cJSON_bool cVar14;
  cJSON_bool cVar15;
  cJSON_bool cVar16;
  cJSON_bool cVar17;
  cJSON_bool cVar18;
  cJSON_bool cVar19;
  cJSON_bool cVar20;
  cJSON_bool cVar21;
  cJSON_bool cVar22;
  cJSON_bool cVar23;
  uint uVar24;
  arg_dbl *paVar25;
  arg_int *paVar26;
  arg_lit *paVar27;
  arg_str *paVar28;
  arg_str *paVar29;
  arg_int *paVar30;
  arg_file *paVar31;
  arg_lit *paVar32;
  arg_lit *paVar33;
  arg_file *paVar34;
  arg_file *paVar35;
  arg_file *paVar36;
  arg_end *end;
  time_t tVar37;
  char *pcVar38;
  int64_t iVar39;
  time_t tVar40;
  char *pcVar41;
  FILE *pFVar42;
  cJSON *object;
  cJSON *pcVar43;
  cJSON *pcVar44;
  char *pcVar45;
  size_t sVar46;
  cJSON *item;
  undefined8 extraout_RAX;
  byte bVar47;
  byte bVar48;
  uint uVar49;
  int32_t *piVar50;
  int level;
  uint uVar51;
  uint uVar52;
  ulong uVar53;
  char *pcVar54;
  long lVar55;
  bool bVar56;
  double dVar57;
  undefined1 auVar58 [16];
  ulong uVar59;
  Instance instance;
  void *argtable [13];
  SolverParams params;
  char timerepr_str [4096];
  double local_21d8;
  FILE *local_21b8;
  SolveStatus local_21b0;
  undefined8 local_21a8;
  int iStack_21a0;
  int iStack_219c;
  double local_2198;
  SolveStatus local_2190;
  double local_2170;
  Solution local_2160;
  cJSON_bool local_2134;
  cJSON_bool local_2130;
  cJSON_bool local_212c;
  FILE *local_2128;
  Instance local_2120;
  TimeRepr local_20d8;
  time_t local_20c0;
  time_t local_20b8;
  long local_20b0;
  arg_lit *local_20a8;
  arg_lit *local_20a0;
  arg_int *local_2098;
  arg_file *local_2090;
  arg_lit *local_2088;
  arg_dbl *local_2080;
  arg_int *local_2078;
  arg_str *local_2070;
  arg_file *local_2068;
  arg_file *local_2060;
  arg_file *local_2058;
  arg_str *local_2050;
  arg_end *local_2048;
  SolverParams local_2040;
  TimeRepr local_1038 [171];
  
  pcVar45 = *argv;
  if (argc == 1) {
    printf("%s: %s\n",PROJECT_NAME,PROJECT_DESCRIPTION);
    print_version();
    putchar(10);
    printf("Try \'%s --help\' for more information.\n",pcVar45);
    return 1;
  }
  paVar25 = arg_dbl0("t","timelimit",(char *)0x0,
                     "define the maximum timelimit in seconds (default 10 minutes)");
  paVar26 = arg_int0("s","seed",(char *)0x0,
                     "define the random seed to use (default is 0, eg compute it from the current time)"
                    );
  paVar27 = arg_lit0("a","treat-sigterm-as-failure",
                     "treat SIGTERM/SIGINT (CTRL-C) abortion as failure and exit with non zero exit status. The JSON report output file will not be generated"
                    );
  paVar28 = arg_strn("D","define","KEY=VALUE",0,argc + 2,"define parameters");
  paVar29 = arg_str0("S","solver","SOLVER","solver to use (default \"mip\")");
  paVar30 = arg_int0((char *)0x0,"loglvl",(char *)0x0,
                     "control the log level (0: fatal&warning logs, 1: info logs, 2: trace logs, 3: debug logs (only in debug builds)"
                    );
  paVar31 = arg_file0("l","log",(char *)0x0,
                      "specify an additional file where logs would be stored (default none)");
  paVar32 = arg_lit0((char *)0x0,"help","print this help and exit");
  paVar33 = arg_lit0((char *)0x0,"version","print version information and exit");
  paVar34 = arg_file1("i","instance",(char *)0x0,"input instance file");
  paVar35 = arg_file0((char *)0x0,"visualize",(char *)0x0,"tour visualization output file");
  paVar36 = arg_file0("w","write-report",(char *)0x0,"write a JSON report output file.");
  end = arg_end(0x10);
  local_20a8 = paVar32;
  local_20a0 = paVar33;
  local_2098 = paVar30;
  local_2090 = paVar31;
  local_2088 = paVar27;
  local_2080 = paVar25;
  local_2078 = paVar26;
  local_2070 = paVar28;
  local_2068 = paVar34;
  local_2060 = paVar35;
  local_2058 = paVar36;
  local_2050 = paVar29;
  local_2048 = end;
  iVar1 = arg_nullcheck(&local_20a8);
  if (iVar1 != 0) {
    pcVar54 = "%s: insufficient memory\n";
LAB_00102b0a:
    printf(pcVar54,pcVar45);
    iVar1 = 1;
LAB_00102c1c:
    arg_freetable(&local_20a8,0xd);
    return iVar1;
  }
  *paVar25->dval = 600.0;
  *paVar26->ival = 0;
  *paVar29->sval = "mip";
  *paVar31->filename = (char *)0x0;
  *paVar35->filename = (char *)0x0;
  *paVar36->filename = (char *)0x0;
  *paVar30->ival = 0;
  iVar1 = arg_parse(argc,argv,&local_20a8);
  if (0 < paVar32->count) {
    iVar1 = 0;
    printf("%s: %s\n",PROJECT_NAME,PROJECT_DESCRIPTION);
    printf("Usage: %s",pcVar45);
    arg_print_syntax((FILE *)_stdout,&local_20a8,"\n");
    arg_print_glossary((FILE *)_stdout,&local_20a8,"  %-32s %s\n");
    cptp_print_list_of_solvers_and_params();
    goto LAB_00102c1c;
  }
  if (0 < iVar1) {
    arg_print_errors((FILE *)_stdout,end,pcVar45);
    pcVar54 = "Try \'%s --help\' for more information.\n";
    goto LAB_00102b0a;
  }
  if (0 < paVar33->count) {
    print_version();
    iVar1 = 0;
    goto LAB_00102c1c;
  }
  iVar1 = *paVar30->ival;
  iVar2 = 0x20;
  if (iVar1 != 1) {
    iVar2 = (uint)(iVar1 == 2) * 0x20 + -0x20;
  }
  level = 0x40;
  if (0 < iVar1) {
    level = iVar2;
  }
  log_set_level(level);
  if (paVar31->count < 1) {
LAB_00102d08:
    local_21b8 = (FILE *)0x0;
  }
  else {
    local_21b8 = fopen(*paVar31->filename,"w");
    if (local_21b8 == (FILE *)0x0) {
      main_cold_1();
      goto LAB_00102d08;
    }
    log_add_fp((FILE *)local_21b8,level);
  }
  iVar1 = paVar27->count;
  pcVar45 = *paVar34->filename;
  pcVar54 = *paVar29->sval;
  dVar57 = *paVar25->dval;
  uVar49 = *paVar26->ival;
  strings = paVar28->sval;
  uVar24 = paVar28->count;
  filepath = *paVar35->filename;
  __filename = *paVar36->filename;
  if (uVar49 == 0) {
    tVar37 = time((time_t *)0x0);
    uVar49 = (int)tVar37 +
             ((int)(SUB168(SEXT816(tVar37) * ZEXT816(0x8000000100000003),8) >> 0x1e) -
             (SUB164(SEXT816(tVar37) * ZEXT816(0x8000000100000003),0xc) >> 0x1f)) * -0x7fffffff;
  }
  local_21d8 = (double)(ulong)uVar49;
  parse(&local_2120,pcVar45);
  if ((((local_2120.num_customers < 1) || (local_2120.num_vehicles < 1)) ||
      (local_2120.vehicle_cap <= 0.0)) || (local_2120.demands == (double *)0x0)) {
    fprintf(_stderr,"%s: Failed to parse file\n",pcVar45);
    uVar51 = 1;
    goto LAB_00103c87;
  }
  memset(&local_2040,0,0x1008);
  if (0x100 < (int)uVar24) {
    main_cold_2();
    printf("%s v%s (%s, revision: %s)\n",PROJECT_NAME,PROJECT_VERSION,GIT_DATE,GIT_SHA1);
    iVar1 = printf("Compiled with %s v%s (%s), %s build\n",C_COMPILER_ID,C_COMPILER_VERSION,
                   C_COMPILER_ABI,BUILD_TYPE,extraout_RAX);
    return iVar1;
  }
  if (0 < (int)uVar24) {
    lVar55 = 0;
    do {
      pcVar41 = *(char **)((long)strings + lVar55);
      pcVar38 = strchr(pcVar41,0x3d);
      if (pcVar38 == (char *)0x0) {
        sVar46 = strlen(pcVar41);
        pcVar38 = pcVar41 + sVar46;
      }
      else {
        *pcVar38 = '\0';
        pcVar38 = pcVar38 + 1;
      }
      *(char **)((long)&local_2040.params[0].name + lVar55 * 2) = pcVar41;
      *(char **)((long)&local_2040.params[0].value + lVar55 * 2) = pcVar38;
      lVar55 = lVar55 + 8;
      local_2040.num_params = uVar24;
    } while ((ulong)uVar24 * 8 - lVar55 != 0);
  }
  solution_create(&local_2160,&local_2120);
  tVar37 = time((time_t *)0x0);
  iVar39 = os_get_nanosecs();
  lVar55 = SUB168(SEXT816(iVar39) * SEXT816(-0x20c49ba5e353f7cf),8);
  pcVar41 = "mip";
  if (pcVar54 != (char *)0x0) {
    pcVar41 = pcVar54;
  }
  SVar3 = cptp_solve(&local_2120,pcVar41,&local_2040,&local_2160,dVar57,uVar49);
  tVar40 = time((time_t *)0x0);
  iVar39 = os_get_nanosecs();
  lVar55 = iVar39 / 1000 + ((lVar55 >> 7) - (lVar55 >> 0x3f));
  bVar56 = SVar3 == SOLVE_STATUS_NULL;
  puts("\n\n###\n###\n###\n");
  pFVar42 = _stdout;
  local_20d8._0_8_ = tVar37;
  local_20d8._8_8_ = tVar40;
  local_20d8._16_8_ = lVar55;
  fprintf(_stdout,"%-16s %s\n","SOLVER:",pcVar54);
  fprintf(pFVar42,"%-16s %f\n",dVar57,"TIMELIM:");
  fprintf(pFVar42,"%-16s %d\n","SEED:",local_21d8);
  fprintf(pFVar42,"%-16s %s\n","INPUT:",pcVar45);
  fprintf(pFVar42,"%-16s %.17g\n",local_2120.vehicle_cap,"VEHICLE_CAP:");
  piVar50 = (int32_t *)(ulong)SVar3;
  fprintf(pFVar42,"%-16s 0x%x\n","STATUS:",piVar50);
  if ((SVar3 & SOLVE_STATUS_ERR) == SOLVE_STATUS_NULL && !bVar56) {
    printf("%-16s [%.17g, %.17g]\n",local_2160.dual_bound,local_2160.primal_bound,"BOUNDS:");
    printf("%-16s %.17g\n",
           (local_2160.primal_bound - local_2160.dual_bound) /
           (ABS(local_2160.primal_bound) + 1e-10),"GAP");
    if ((SVar3 & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL) != SOLVE_STATUS_NULL) {
      printf("%-16s ");
      if (-1 < local_2160.tour.num_customers) {
        uVar53 = 0;
        while (uVar52 = local_2160.tour.succ[uVar53], uVar52 != 0) {
          printf("%d ");
          if (((int)uVar52 < 0) ||
             (uVar53 = (ulong)uVar52, local_2160.tour.num_customers < (int)uVar52))
          goto LAB_00103217;
        }
        printf("%d");
        putchar(10);
        tour_eval(&local_2120,&local_2160.tour);
        if (-1 < local_2160.tour.num_customers) {
          if (-1 < *local_2160.tour.comp) {
            local_2198 = *local_2120.demands + 0.0;
            uVar52 = 0;
            goto LAB_001031b9;
          }
          local_2198 = 0.0;
          local_2170 = 0.0;
          piVar50 = local_2160.tour.comp;
          goto LAB_00103254;
        }
      }
      goto LAB_00103217;
    }
  }
  else {
    printf("%-16s Could not solve\n","ERR:");
  }
LAB_001032b3:
  bVar47 = 0 < iVar1 & (byte)((SVar3 & SOLVE_STATUS_ABORTION_SIGTERM) >> 4);
  bVar48 = bVar47 | (byte)SVar3 | bVar56;
  uVar51 = (uint)CONCAT71((int7)((ulong)piVar50 >> 8),bVar48);
  uVar52 = uVar51;
  pcVar41 = ctime((time_t *)&local_20d8);
  printf("%-16s %s","STARTED:",pcVar41);
  pcVar41 = ctime((time_t *)&local_20d8.minutes);
  printf("%-16s %s","ENDED:",pcVar41);
  printf("%-16s ","TOOK:");
  timerepr_from_usecs(local_1038,local_20d8._16_8_);
  print_timerepr((FILE *)_stdout,local_1038);
  putchar(10);
  pcVar41 = "TRUE";
  if (bVar47 != 0 || ((SVar3 & SOLVE_STATUS_ERR) != SOLVE_STATUS_NULL || bVar56)) {
    pcVar41 = "FALSE";
  }
  printf("%-16s %s\n","SUCCESS",pcVar41);
  if (bVar47 == 0 && ((SVar3 & SOLVE_STATUS_ERR) == SOLVE_STATUS_NULL && !bVar56)) {
    local_20c0 = tVar37;
    local_20b8 = tVar40;
    local_20b0 = lVar55;
    if (__filename != (char *)0x0) {
      pFVar42 = fopen(__filename,"w");
      if (pFVar42 == (FILE *)0x0) {
        log_log(0x80,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/main.c"
                ,0x99,"%s: failed to open file for writing JSON report",__filename);
      }
      else {
        object = cJSON_CreateObject();
        if (object == (cJSON *)0x0) {
          log_log(0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/main.c"
                  ,0x9f,"%s :: Failed to create JSON root object","writeout_json_report");
        }
        else {
          local_21b0 = SVar3 & SOLVE_STATUS_ERR;
          local_2190 = SVar3 & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL;
          local_2128 = pFVar42;
          pcVar43 = cJSON_CreateString(pcVar54);
          cVar4 = cJSON_AddItemToObject(object,"solverName",pcVar43);
          pcVar43 = cJSON_CreateNumber(dVar57);
          cVar5 = cJSON_AddItemToObject(object,"timeLimit",pcVar43);
          pcVar43 = cJSON_CreateNumber((double)(int)uVar49);
          cVar6 = cJSON_AddItemToObject(object,"randomSeed",pcVar43);
          pcVar43 = cJSON_CreateStringArray(strings,uVar24);
          cVar7 = cJSON_AddItemToObject(object,"cmdLineDefines",pcVar43);
          pcVar43 = cJSON_CreateString(pcVar45);
          cVar8 = cJSON_AddItemToObject(object,"inputFile",pcVar43);
          pcVar43 = cJSON_CreateObject();
          cVar9 = cJSON_AddItemToObject(object,"instanceInfo",pcVar43);
          if (local_2120.name == (char *)0x0) {
            local_2120.name = "";
          }
          pcVar44 = cJSON_CreateString(local_2120.name);
          cVar10 = cJSON_AddItemToObject(pcVar43,"name",pcVar44);
          if (local_2120.comment == (char *)0x0) {
            local_2120.comment = "";
          }
          pcVar44 = cJSON_CreateString(local_2120.comment);
          cVar11 = cJSON_AddItemToObject(pcVar43,"comment",pcVar44);
          pcVar44 = cJSON_CreateNumber(local_2120.vehicle_cap);
          cVar12 = cJSON_AddItemToObject(pcVar43,"vehicleCap",pcVar44);
          pcVar44 = cJSON_CreateNumber((double)local_2120.num_customers);
          cVar13 = cJSON_AddItemToObject(pcVar43,"numCustomers",pcVar44);
          pcVar44 = cJSON_CreateNumber((double)local_2120.num_vehicles);
          cVar14 = cJSON_AddItemToObject(pcVar43,"numVehicles",pcVar44);
          pcVar43 = cJSON_CreateObject();
          cVar15 = cJSON_AddItemToObject(object,"solveStatus",pcVar43);
          pcVar44 = cJSON_CreateNumber((double)SVar3);
          cVar16 = cJSON_AddItemToObject(pcVar43,"code",pcVar44);
          pcVar44 = cJSON_CreateBool(local_21b0);
          cVar17 = cJSON_AddItemToObject(pcVar43,"erroredOut",pcVar44);
          pcVar44 = cJSON_CreateBool(local_2190 >> 2);
          cVar18 = cJSON_AddItemToObject(pcVar43,"containsPrimalSolution",pcVar44);
          pcVar44 = cJSON_CreateBool(SVar3 >> 1 & 1);
          local_212c = cJSON_AddItemToObject(pcVar43,"closedProblem",pcVar44);
          pcVar44 = cJSON_CreateBool(SVar3 >> 3 & 1);
          local_2130 = cJSON_AddItemToObject(pcVar43,"resExhaustionAbortion",pcVar44);
          pcVar44 = cJSON_CreateBool(SVar3 >> 4 & 1);
          cVar19 = cJSON_AddItemToObject(pcVar43,"sigTermAbortion",pcVar44);
          pcVar43 = cJSON_CreateObject();
          local_2134 = cJSON_AddItemToObject(object,"timingInfo",pcVar43);
          lVar55 = local_20b0;
          timerepr_from_usecs(&local_20d8,local_20b0);
          timerepr_to_string(&local_20d8,(char *)local_1038,0x1000);
          pcVar44 = cJSON_CreateNumber((double)lVar55 * 1e-06);
          cVar20 = cJSON_AddItemToObject(pcVar43,"took",pcVar44);
          pcVar44 = cJSON_CreateString((char *)local_1038);
          cVar21 = cJSON_AddItemToObject(pcVar43,"tookRepr",pcVar44);
          pcVar45 = ctime(&local_20c0);
          sVar46 = strlen(pcVar45);
          pcVar45[sVar46 - 1] = '\0';
          pcVar44 = cJSON_CreateString(pcVar45);
          cVar22 = cJSON_AddItemToObject(pcVar43,"started",pcVar44);
          pcVar45 = ctime(&local_20b8);
          sVar46 = strlen(pcVar45);
          pcVar45[sVar46 - 1] = '\0';
          pcVar44 = cJSON_CreateString(pcVar45);
          cVar23 = cJSON_AddItemToObject(pcVar43,"ended",pcVar44);
          uVar53 = CONCAT44(cVar21,cVar20) & CONCAT44(cVar16,cVar15) &
                   CONCAT44(local_2130,local_212c) & CONCAT44(cVar12,cVar11);
          uVar59 = CONCAT44(cVar23,cVar22) & CONCAT44(cVar18,cVar17) &
                   CONCAT44(local_2134,cVar19) & CONCAT44(cVar14,cVar13);
          pcVar43 = cJSON_CreateObject();
          cVar11 = cJSON_AddItemToObject(object,"bounds",pcVar43);
          pcVar44 = cJSON_CreateNumber(local_2160.dual_bound);
          cVar12 = cJSON_AddItemToObject(pcVar43,"dual",pcVar44);
          pcVar44 = cJSON_CreateNumber(local_2160.primal_bound);
          cVar13 = cJSON_AddItemToObject(pcVar43,"primal",pcVar44);
          pcVar44 = cJSON_CreateNumber((local_2160.primal_bound - local_2160.dual_bound) /
                                       (ABS(local_2160.primal_bound) + 1e-10));
          cVar14 = cJSON_AddItemToObject(pcVar43,"gap",pcVar44);
          local_21a8._0_4_ = (int)uVar53;
          local_21a8._4_4_ = (int)(uVar53 >> 0x20);
          iStack_21a0 = (int)uVar59;
          iStack_219c = (int)(uVar59 >> 0x20);
          auVar58._0_4_ = (int)local_21a8 << 0x1f;
          auVar58._4_4_ = local_21a8._4_4_ << 0x1f;
          auVar58._8_4_ = iStack_21a0 << 0x1f;
          auVar58._12_4_ = iStack_219c << 0x1f;
          iVar1 = movmskps(uVar52,auVar58);
          bVar47 = (byte)cVar12 & (byte)cVar11 & (byte)cVar13 &
                   (byte)cVar10 &
                   (byte)cVar9 & (byte)cVar8 & (byte)cVar7 & (byte)cVar5 & (byte)cVar4 & (byte)cVar6
                   & iVar1 == 0xf & (byte)cVar14;
          if (local_2190 != SOLVE_STATUS_NULL) {
            pcVar43 = cJSON_CreateObject();
            cVar4 = cJSON_AddItemToObject(object,"tourInfo",pcVar43);
            dVar57 = tour_eval(&local_2120,&local_2160.tour);
            if (local_2160.tour.num_customers < 0) goto LAB_00103217;
            if (-1 < *local_2160.tour.comp) {
              local_21d8 = *local_2120.profits + 0.0;
              uVar49 = 0;
              do {
                uVar24 = local_2160.tour.succ[uVar49];
                if ((ulong)uVar24 == 0) {
                  local_21a8 = *local_2120.demands + 0.0;
                  uVar49 = 0;
                  goto LAB_00103a74;
                }
                if ((int)uVar24 < 0) {
LAB_00103d11:
                  __assert_fail("next_vertex >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                                ,0xa9,"double tour_profit(const Instance *, Tour *)");
                }
                if (uVar24 == uVar49) {
LAB_00103cf2:
                  __assert_fail("next_vertex != curr_vertex",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                                ,0xaa,"double tour_profit(const Instance *, Tour *)");
                }
                local_21d8 = local_21d8 + local_2120.profits[uVar24];
                uVar49 = uVar24;
              } while (uVar24 <= (uint)local_2160.tour.num_customers);
              goto LAB_00103217;
            }
            local_21d8 = 0.0;
            local_21a8 = 0.0;
LAB_00103abc:
            pcVar44 = cJSON_CreateNumber(dVar57);
            cVar5 = cJSON_AddItemToObject(pcVar43,"cost",pcVar44);
            pcVar44 = cJSON_CreateNumber(local_21d8);
            cVar6 = cJSON_AddItemToObject(pcVar43,"profit",pcVar44);
            pcVar44 = cJSON_CreateNumber(local_21a8);
            cVar7 = cJSON_AddItemToObject(pcVar43,"demand",pcVar44);
            pcVar44 = cJSON_CreateArray();
            uVar49 = 0;
            do {
              if (((int)uVar49 < 0) || (local_2160.tour.num_customers < (int)uVar49))
              goto LAB_00103217;
              uVar24 = local_2160.tour.succ[uVar49];
              item = cJSON_CreateNumber((double)(int)uVar49);
              cJSON_AddItemToArray(pcVar44,item);
              uVar49 = uVar24;
            } while (uVar24 != 0);
            cVar8 = cJSON_AddItemToObject(pcVar43,"route",pcVar44);
            bVar47 = (byte)cVar7 & (byte)cVar6 & (byte)cVar5 & bVar47 & (byte)cVar4 & (byte)cVar8;
          }
          pcVar43 = cJSON_CreateObject();
          uVar49 = cJSON_AddItemToObject(object,"constants",pcVar43);
          pcVar44 = cJSON_CreateNumber(1e-06);
          uVar24 = cJSON_AddItemToObject(pcVar43,"COST_TOLERANCE",pcVar44);
          uVar51 = (uint)bVar48;
          if (((bVar47 == 0) || ((uVar49 & 1) == 0)) || ((uVar24 & 1) == 0)) {
            log_log(0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/main.c"
                    ,0x133,
                    "%s :: Failed to add all the necessary JSON elements to the parent JSON root object"
                    ,"writeout_json_report");
            pFVar42 = local_2128;
          }
          else {
            pcVar45 = cJSON_Print(object);
            pFVar42 = local_2128;
            fputs(pcVar45,local_2128);
            free(pcVar45);
          }
          cJSON_Delete(object);
        }
        fclose(pFVar42);
      }
    }
    if (filepath != (char *)0x0) {
      render_tour_image(filepath,&local_2120,&local_2160.tour,(char *)0x0);
    }
  }
  instance_destroy(&local_2120);
  solution_destroy(&local_2160);
  uVar51 = uVar51 & 1;
LAB_00103c87:
  arg_freetable(&local_20a8,0xd);
  if (local_21b8 != (FILE *)0x0) {
    fclose(local_21b8);
  }
  return uVar51;
  while( true ) {
    if ((int)uVar51 < 0) goto LAB_00103cd3;
    if (uVar51 == uVar52) goto LAB_00103cb4;
    local_2198 = local_2198 + local_2120.demands[uVar51];
    uVar52 = uVar51;
    if ((uint)local_2160.tour.num_customers < uVar51) break;
LAB_001031b9:
    uVar51 = local_2160.tour.succ[uVar52];
    if ((ulong)uVar51 == 0) {
      local_2170 = *local_2120.profits + 0.0;
      uVar52 = 0;
      goto LAB_001031f2;
    }
  }
  goto LAB_00103217;
  while( true ) {
    if ((int)uVar51 < 0) goto LAB_00103d11;
    if (uVar51 == uVar52) goto LAB_00103cf2;
    local_2170 = local_2170 + local_2120.profits[uVar51];
    uVar52 = uVar51;
    if ((uint)local_2160.tour.num_customers < uVar51) break;
LAB_001031f2:
    uVar51 = local_2160.tour.succ[uVar52];
    piVar50 = local_2160.tour.succ;
    if ((ulong)uVar51 == 0) goto LAB_00103254;
  }
  goto LAB_00103217;
LAB_00103254:
  printf("%-16s %.17g\n","TOUR COST:");
  printf("%-16s %.17g\n",local_2170,"TOUR PROFIT:");
  printf("%-16s %.17g   (%.3g%%)\n",local_2198,(local_2198 / local_2120.vehicle_cap) * 100.0,
         "TOUR DEMAND:");
  goto LAB_001032b3;
LAB_00103a74:
  do {
    uVar24 = local_2160.tour.succ[uVar49];
    if ((ulong)uVar24 == 0) goto LAB_00103abc;
    if ((int)uVar24 < 0) {
LAB_00103cd3:
      __assert_fail("next_vertex >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                    ,0x98,"double tour_demand(const Instance *, Tour *)");
    }
    if (uVar24 == uVar49) {
LAB_00103cb4:
      __assert_fail("next_vertex != curr_vertex",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                    ,0x99,"double tour_demand(const Instance *, Tour *)");
    }
    local_21a8 = local_21a8 + local_2120.demands[uVar24];
    uVar49 = uVar24;
  } while (uVar24 <= (uint)local_2160.tour.num_customers);
LAB_00103217:
  __assert_fail("idx >= 0 && idx < len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/types.h"
                ,0x6c,"int32_t *veci32_access(int32_t *, int32_t, int32_t)");
}

Assistant:

int main(int argc, char **argv) {
    const char *progname = argv[0];
    FILE *log_file_handle = NULL;

    if (argc == 1) {
        print_brief_description(progname);
        print_version();
        printf("\n");
        print_use_help_for_more_information(progname);
        return EXIT_FAILURE;
    }

    struct arg_dbl *timelimit = arg_dbl0(
        "t", "timelimit", NULL,
        "define the maximum timelimit in seconds (default 10 minutes)");
    struct arg_int *randomseed =
        arg_int0("s", "seed", NULL,
                 "define the random seed to use (default is 0, eg compute it "
                 "from the current time)");
    struct arg_lit *treat_sigterm_as_failure =
        arg_lit0("a", "treat-sigterm-as-failure",
                 "treat SIGTERM/SIGINT (CTRL-C) abortion as failure and exit "
                 "with non zero exit status. The JSON report output file will "
                 "not be generated");
    struct arg_str *defines =
        arg_strn("D", "define", "KEY=VALUE", 0, argc + 2, "define parameters");
    struct arg_str *solver =
        arg_str0("S", "solver", "SOLVER", "solver to use (default \"mip\")");
    struct arg_int *loglvl =
        arg_int0(NULL, "loglvl", NULL,
                 "control the log level (0: fatal&warning logs, 1: info logs, "
                 "2: trace logs, 3: debug logs (only in debug builds)");
    struct arg_file *logfile =
        arg_file0("l", "log", NULL,
                  "specify an additional file where logs would be "
                  "stored (default none)");
    struct arg_lit *help = arg_lit0(NULL, "help", "print this help and exit");
    struct arg_lit *version =
        arg_lit0(NULL, "version", "print version information and exit");
    struct arg_file *instance =
        arg_file1("i", "instance", NULL, "input instance file");

    struct arg_file *vis_path =
        arg_file0(NULL, "visualize", NULL, "tour visualization output file");
    struct arg_file *json_report_path = arg_file0(
        "w", "write-report", NULL, "write a JSON report output file.");

    struct arg_end *end = arg_end(MAX_NUMBER_OF_ERRORS_TO_DISPLAY);

    void *argtable[] = {help,
                        version,
                        loglvl,
                        logfile,
                        treat_sigterm_as_failure,
                        timelimit,
                        randomseed,
                        defines,
                        instance,
                        vis_path,
                        json_report_path,
                        solver,
                        end};

    int exitcode = 0;

    /* verify the argtable[] entries were allocated successfully */
    if (arg_nullcheck(argtable) != 0) {
        printf("%s: insufficient memory\n", progname);
        exitcode = 1;
        goto exit;
    }

    // Default time limit
    timelimit->dval[0] = DEFAULT_TIME_LIMIT;
    // Default random seed
    randomseed->ival[0] = 0;
    // Default solver
    solver->sval[0] = "mip";
    // No logging file by default
    logfile->filename[0] = NULL;
    // No tour visualization file by default
    vis_path->filename[0] = NULL;
    // No JSON report output file by default
    json_report_path->filename[0] = NULL;
    // Contain only fatal&warning log messages by default
    loglvl->ival[0] = 0;

    {
        int nerrors = arg_parse(argc, argv, argtable);

        /* special case: '--help' takes precedence over error reporting */
        if (help->count > 0) {
            print_brief_description(progname);
            printf("Usage: %s", progname);
            arg_print_syntax(stdout, argtable, "\n");
            arg_print_glossary(stdout, argtable, "  %-32s %s\n");
            cptp_print_list_of_solvers_and_params();
            exitcode = 0;
            goto exit;
        }

        if (nerrors > 0) {
            arg_print_errors(stdout, end, progname);
            print_use_help_for_more_information(progname);
            exitcode = 1;
            goto exit;
        }
    }

    /* special case: '--version' takes precedence error reporting */
    if (version->count > 0) {
        print_version();
        exitcode = 0;
        goto exit;
    }

    int32_t iloglvl = LOG_WARN;
    if (loglvl->ival[0] <= 0) {
        iloglvl = LOG_WARN;
    } else if (loglvl->ival[0] == 1) {
        iloglvl = LOG_INFO;
    } else if (loglvl->ival[0] == 2) {
        iloglvl = LOG_TRACE;
    } else {
        iloglvl = LOG_DEBUG;
    }

    log_set_level(iloglvl);

    if (logfile->count > 0) {
        log_file_handle = fopen(logfile->filename[0], "w");
        if (log_file_handle) {
            log_add_fp(log_file_handle, iloglvl);
        } else {
            fprintf(stderr, "%s: Failed to open for logging\n",
                    logfile->filename[0]);
        }
    }

    AppCtx ctx = {.loglvl = iloglvl,
                  .instance_filepath = instance->filename[0],
                  .treat_sigterm_as_failure =
                      treat_sigterm_as_failure->count > 0,
                  .solver = solver->sval[0],
                  .timelimit = timelimit->dval[0],
                  .randomseed = randomseed->ival[0],
                  .defines = defines->sval,
                  .num_defines = defines->count,
                  .vis_path = vis_path->filename[0],
                  .json_report_path = json_report_path->filename[0]};

    if (ctx.randomseed == 0) {
        ctx.randomseed = (int32_t)(time(NULL) % INT32_MAX);
    }

    exitcode = main2(&ctx);

exit:
    arg_freetable(argtable, ARRAY_LEN(argtable));

    if (log_file_handle) {
        fclose(log_file_handle);
        log_file_handle = NULL;
    }

    return exitcode;
}